

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

char ** readdir_raw(char *dir,int return_subdirs,char *mask)

{
  uint uVar1;
  int iVar2;
  DIR *pDVar3;
  size_t sVar4;
  DIR *__dirp;
  dirent *pdVar5;
  char *pcVar6;
  int local_30a4;
  int local_3094;
  int local_308c;
  char **local_3080;
  char *p;
  char buffer_1 [4096];
  char *name;
  int is_subdir;
  dirent *data;
  int nonempty;
  DIR *z;
  DIR *none;
  size_t n;
  char with_slash [4096];
  char buffer [4096];
  char *local_30;
  char **results;
  char *mask_local;
  char *pcStack_18;
  int return_subdirs_local;
  char *dir_local;
  
  local_30 = (char *)0x0;
  results = (char **)mask;
  mask_local._4_4_ = return_subdirs;
  pcStack_18 = dir;
  pDVar3 = (DIR *)stb_strscpy(with_slash + 0xff8,dir,0x1000);
  if ((pDVar3 == (DIR *)0x0) || ((DIR *)0xfff < pDVar3)) {
    dir_local = (char *)0x0;
  }
  else {
    stb_fixpath(with_slash + 0xff8);
    none = pDVar3 + -1;
    if ((none != (DIR *)0x0) && ((pDVar3 + -0x103a)[(long)&stack0x00000000] != (DIR)0x2f)) {
      (with_slash + 0xff8)[(long)none] = '/';
      none = pDVar3;
    }
    (with_slash + 0xff8)[(long)none] = '\0';
    sVar4 = stb_strscpy((char *)&n,with_slash + 0xff8,0x1000);
    if (sVar4 == 0) {
      dir_local = (char *)0x0;
    }
    else {
      __dirp = opendir(pcStack_18);
      if (__dirp != (DIR *)0x0) {
        pdVar5 = readdir(__dirp);
        while (pdVar5 != (dirent *)0x0) {
          pcVar6 = pdVar5->d_name;
          sVar4 = stb_strscpy(with_slash + 0xff8 + (long)none,pcVar6,0x1000 - (long)none);
          if (sVar4 == 0) break;
          uVar1 = (uint)((pdVar5->d_type & 4) != 0);
          if (((uVar1 == mask_local._4_4_) &&
              ((uVar1 == 0 || (iVar2 = isdotdirname(pcVar6), iVar2 == 0)))) &&
             ((results == (char **)0x0 ||
              (iVar2 = stb_wildmatchi((char *)results,pcVar6), iVar2 != 0)))) {
            local_3080 = &p;
            iVar2 = stb_snprintf((char *)&p,0x1000,"%s%s",&n,pcVar6);
            if (iVar2 < 0) break;
            if (((char)p == '.') && (p._1_1_ == '/')) {
              local_3080 = (char **)((long)&p + 2);
            }
            pcVar6 = strdup((char *)local_3080);
            if (local_30 == (char *)0x0) {
              local_308c = 0;
            }
            else {
              local_308c = *(int *)(local_30 + -0x10);
            }
            if (local_30 == (char *)0x0) {
              local_3094 = 0;
            }
            else {
              local_3094 = *(int *)(local_30 + -0xc);
            }
            if (local_3094 < local_308c + 1) {
              stb__arr_addlen_(&local_30,8,1);
            }
            else {
              *(int *)(local_30 + -0x10) = *(int *)(local_30 + -0x10) + 1;
            }
            if (local_30 == (char *)0x0) {
              local_30a4 = 0;
            }
            else {
              local_30a4 = *(int *)(local_30 + -0x10);
            }
            *(char **)(local_30 + (long)local_30a4 * 8 + -8) = pcVar6;
          }
          pdVar5 = readdir(__dirp);
        }
        closedir(__dirp);
      }
      dir_local = local_30;
    }
  }
  return (char **)dir_local;
}

Assistant:

static char **readdir_raw(char *dir, int return_subdirs, char *mask)
{
   char **results = NULL;
   char buffer[4096], with_slash[4096];
   size_t n;

   #ifdef _MSC_VER
      stb__wchar *ws;
      struct _wfinddata_t data;
   #ifdef _WIN64
      const intptr_t none = -1;
      intptr_t z;
   #else
      const long none = -1;
      long z;
   #endif
   #else // !_MSC_VER
      const DIR *none = NULL;
      DIR *z;
   #endif

   n = stb_strscpy(buffer,dir,sizeof(buffer));
   if (!n || n >= sizeof(buffer))
      return NULL;
   stb_fixpath(buffer);
   n--;

   if (n > 0 && (buffer[n-1] != '/')) {
      buffer[n++] = '/';
   }
   buffer[n] = 0;
   if (!stb_strscpy(with_slash,buffer,sizeof(with_slash)))
      return NULL;

   #ifdef _MSC_VER
      if (!stb_strscpy(buffer+n,"*.*",sizeof(buffer)-n))
         return NULL;
      ws = stb__from_utf8(buffer);
      z = _wfindfirst((const wchar_t *)ws, &data);
   #else
      z = opendir(dir);
   #endif

   if (z != none) {
      int nonempty = STB_TRUE;
      #ifndef _MSC_VER
      struct dirent *data = readdir(z);
      nonempty = (data != NULL);
      #endif

      if (nonempty) {

         do {
            int is_subdir;
            #ifdef _MSC_VER
            char *name = stb__to_utf8((stb__wchar *)data.name);
            if (name == NULL) {
               fprintf(stderr, "%s to convert '%S' to %s!\n", "Unable", data.name, "utf8");
               continue;
            }
            is_subdir = !!(data.attrib & _A_SUBDIR);
            #else
            char *name = data->d_name;
            if (!stb_strscpy(buffer+n,name,sizeof(buffer)-n))
               break;
            // Could follow DT_LNK, but would need to check for recursive links.
            is_subdir = !!(data->d_type & DT_DIR);
            #endif

            if (is_subdir == return_subdirs) {
               if (!is_subdir || !isdotdirname(name)) {
                  if (!mask || stb_wildmatchi(mask, name)) {
                     char buffer[4096],*p=buffer;
                     if ( stb_snprintf(buffer, sizeof(buffer), "%s%s", with_slash, name) < 0 )
                        break;
                     if (buffer[0] == '.' && buffer[1] == '/')
                        p = buffer+2;
                     stb_arr_push(results, strdup(p));
                  }
               }
            }
         }
         #ifdef _MSC_VER
         while (0 == _wfindnext(z, &data));
         #else
         while ((data = readdir(z)) != NULL);
         #endif
      }
      #ifdef _MSC_VER
         _findclose(z);
      #else
         closedir(z);
      #endif
   }
   return results;
}